

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
               sqlite3_value **argv)

{
  Rtree *pRtree;
  double dVar1;
  u64 n;
  sqlite3_vtab_cursor sVar2;
  int iVar3;
  i64 iVar4;
  RtreeSearchPoint *pRVar5;
  sqlite3_vtab *psVar6;
  uint *__src;
  undefined8 *puVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  i64 iNode;
  RtreeNode *pLeaf;
  int iCell;
  RtreeNode *pRoot;
  int local_84;
  sqlite3_int64 local_58;
  sqlite3_vtab_cursor local_50;
  int local_44;
  sqlite3_vtab_cursor local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pRtree = (Rtree *)pVtabCursor->pVtab;
  local_40.pVtab = (sqlite3_vtab *)0x0;
  local_44 = 0;
  pRtree->nBusy = pRtree->nBusy + 1;
  resetCursor((RtreeCursor *)pVtabCursor);
  *(int *)((long)&pVtabCursor[1].pVtab + 4) = idxNum;
  if (idxNum == 1) {
    local_50.pVtab = (sqlite3_vtab *)&DAT_aaaaaaaaaaaaaaaa;
    iVar4 = sqlite3VdbeIntValue(*argv);
    local_58 = 0;
    iVar3 = sqlite3_value_numeric_type(*argv);
    if (iVar3 == 1) {
LAB_001f61f9:
      local_84 = findLeafNode(pRtree,iVar4,(RtreeNode **)&local_50,&local_58);
      sVar2.pVtab = local_50.pVtab;
      if (local_50.pVtab != (sqlite3_vtab *)0x0 && local_84 == 0) {
        pRVar5 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,'\0');
        pVtabCursor[0xb].pVtab = sVar2.pVtab;
        pRVar5->id = local_58;
        pRVar5->eWithin = '\x01';
        local_84 = nodeRowidIndex(pRtree,(RtreeNode *)sVar2.pVtab[1].pModule,iVar4,&local_44);
        pRVar5->iCell = (u8)local_44;
        goto LAB_001f65a1;
      }
    }
    else {
      local_84 = 0;
      if (iVar3 == 2) {
        dVar1 = sqlite3VdbeRealValue(*argv);
        iVar3 = sqlite3IntFloatCompare(iVar4,dVar1);
        local_84 = 0;
        if (iVar3 == 0) goto LAB_001f61f9;
      }
    }
    *(undefined1 *)&pVtabCursor[1].pVtab = 1;
  }
  else {
    local_84 = nodeAcquire(pRtree,1,(RtreeNode *)0x0,(RtreeNode **)&local_40);
    if (argc < 1 || local_84 != 0) {
      if (local_84 == 0) {
LAB_001f62df:
        pRVar5 = rtreeSearchPointNew((RtreeCursor *)pVtabCursor,0.0,(char)pRtree->iDepth + '\x01');
        if (pRVar5 == (RtreeSearchPoint *)0x0) {
          local_84 = 7;
          goto LAB_001f65ba;
        }
        pRVar5->id = 1;
        pRVar5->eWithin = '\x01';
        pRVar5->iCell = '\0';
        pVtabCursor[0xb].pVtab = local_40.pVtab;
        local_40.pVtab = (sqlite3_vtab *)0x0;
        local_84 = rtreeStepToLeaf((RtreeCursor *)pVtabCursor);
      }
    }
    else {
      iVar3 = sqlite3_initialize();
      if (iVar3 == 0) {
        n = (ulong)(uint)argc * 0x18;
        psVar6 = (sqlite3_vtab *)sqlite3Malloc(n);
        pVtabCursor[3].pVtab = psVar6;
        *(int *)&pVtabCursor[2].pVtab = argc;
        local_84 = 7;
        if (psVar6 != (sqlite3_vtab *)0x0) {
          lVar10 = 0;
          memset(psVar6,0,n);
          memset(pVtabCursor + 0x10,0,(long)pRtree->iDepth * 4 + 4);
          uVar11 = 0;
          do {
            psVar6 = pVtabCursor[3].pVtab;
            iVar3 = sqlite3_value_numeric_type(argv[uVar11]);
            uVar9 = (uint)idxStr[uVar11 * 2];
            *(uint *)((long)&psVar6->pModule + lVar10 * 4 + 4) = uVar9;
            *(int *)((long)&psVar6->pModule + lVar10 * 4) = idxStr[uVar11 * 2 + 1] + -0x30;
            if ((int)uVar9 < 0x46) {
              if (iVar3 == 2) {
                dVar1 = sqlite3VdbeRealValue(argv[uVar11]);
                *(double *)(&psVar6->nRef + lVar10) = dVar1;
              }
              else if (iVar3 == 1) {
                iVar4 = sqlite3VdbeIntValue(argv[uVar11]);
                *(double *)(&psVar6->nRef + lVar10) = (double)iVar4;
                if (iVar4 - 0x1000000000000U < 0xfffe000000000001) {
                  iVar3 = *(int *)((long)&psVar6->pModule + lVar10 * 4 + 4);
                  if (iVar3 == 0x45) {
                    *(undefined4 *)((long)&psVar6->pModule + lVar10 * 4 + 4) = 0x44;
                  }
                  else if (iVar3 == 0x43) {
                    *(undefined4 *)((long)&psVar6->pModule + lVar10 * 4 + 4) = 0x42;
                  }
                }
              }
              else {
                *(undefined8 *)(&psVar6->nRef + lVar10) = 0;
                if ((iVar3 == 5) || ((uVar9 & 0xfffffffe) != 0x42)) {
                  *(undefined4 *)((long)&psVar6->pModule + lVar10 * 4 + 4) = 0x40;
                }
                else {
                  *(undefined4 *)((long)&psVar6->pModule + lVar10 * 4 + 4) = 0x3f;
                }
              }
            }
            else {
              __src = (uint *)sqlite3_value_pointer(argv[uVar11],"RtreeMatchArg");
              if (__src == (uint *)0x0) {
                local_84 = 1;
                goto LAB_001f65a1;
              }
              uVar9 = *__src;
              iVar3 = sqlite3_initialize();
              if ((iVar3 != 0) ||
                 (puVar7 = (undefined8 *)sqlite3Malloc((ulong)uVar9 + 0x70),
                 puVar7 == (undefined8 *)0x0)) goto LAB_001f65a1;
              puVar7[0xc] = 0;
              puVar7[0xd] = 0;
              puVar7[10] = 0;
              puVar7[0xb] = 0;
              puVar7[8] = 0;
              puVar7[9] = 0;
              puVar7[6] = 0;
              puVar7[7] = 0;
              puVar7[4] = 0;
              puVar7[5] = 0;
              puVar7[2] = 0;
              puVar7[3] = 0;
              *puVar7 = 0;
              puVar7[1] = 0;
              memcpy(puVar7 + 0xe,__src,(ulong)*__src);
              lVar8 = puVar7[0xf];
              *puVar7 = puVar7[0x12];
              *(undefined4 *)(puVar7 + 1) = *(undefined4 *)(puVar7 + 0x13);
              puVar7[2] = puVar7 + 0x15;
              puVar7[0xd] = puVar7[0x14];
              if (lVar8 == 0) {
                *(undefined4 *)((long)&psVar6->pModule + lVar10 * 4 + 4) = 0x47;
                lVar8 = puVar7[0x10];
              }
              *(long *)(&psVar6->nRef + lVar10) = lVar8;
              *(undefined8 **)((long)&psVar6->zErrMsg + lVar10 * 4) = puVar7;
              *(uint *)(puVar7 + 7) = (uint)pRtree->nDim2;
              puVar7[6] = pVtabCursor + 0x10;
              *(int *)(puVar7 + 8) = pRtree->iDepth + 1;
            }
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 6;
          } while ((uint)argc != uVar11);
          goto LAB_001f62df;
        }
      }
      else {
        pVtabCursor[3].pVtab = (sqlite3_vtab *)0x0;
        *(int *)&pVtabCursor[2].pVtab = argc;
        local_84 = 7;
      }
    }
  }
LAB_001f65a1:
  nodeRelease(pRtree,(RtreeNode *)local_40.pVtab);
  rtreeRelease(pRtree);
LAB_001f65ba:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_84;
}

Assistant:

static int rtreeFilter(
  sqlite3_vtab_cursor *pVtabCursor,
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  Rtree *pRtree = (Rtree *)pVtabCursor->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeNode *pRoot = 0;
  int ii;
  int rc = SQLITE_OK;
  int iCell = 0;

  rtreeReference(pRtree);

  /* Reset the cursor to the same state as rtreeOpen() leaves it in. */
  resetCursor(pCsr);

  pCsr->iStrategy = idxNum;
  if( idxNum==1 ){
    /* Special case - lookup by rowid. */
    RtreeNode *pLeaf;        /* Leaf on which the required cell resides */
    RtreeSearchPoint *p;     /* Search point for the leaf */
    i64 iRowid = sqlite3_value_int64(argv[0]);
    i64 iNode = 0;
    int eType = sqlite3_value_numeric_type(argv[0]);
    if( eType==SQLITE_INTEGER
     || (eType==SQLITE_FLOAT
         && 0==sqlite3IntFloatCompare(iRowid,sqlite3_value_double(argv[0])))
    ){
      rc = findLeafNode(pRtree, iRowid, &pLeaf, &iNode);
    }else{
      rc = SQLITE_OK;
      pLeaf = 0;
    }
    if( rc==SQLITE_OK && pLeaf!=0 ){
      p = rtreeSearchPointNew(pCsr, RTREE_ZERO, 0);
      assert( p!=0 );  /* Always returns pCsr->sPoint */
      pCsr->aNode[0] = pLeaf;
      p->id = iNode;
      p->eWithin = PARTLY_WITHIN;
      rc = nodeRowidIndex(pRtree, pLeaf, iRowid, &iCell);
      p->iCell = (u8)iCell;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-F1:");
    }else{
      pCsr->atEOF = 1;
    }
  }else{
    /* Normal case - r-tree scan. Set up the RtreeCursor.aConstraint array
    ** with the configured constraints.
    */
    rc = nodeAcquire(pRtree, 1, 0, &pRoot);
    if( rc==SQLITE_OK && argc>0 ){
      pCsr->aConstraint = sqlite3_malloc64(sizeof(RtreeConstraint)*argc);
      pCsr->nConstraint = argc;
      if( !pCsr->aConstraint ){
        rc = SQLITE_NOMEM;
      }else{
        memset(pCsr->aConstraint, 0, sizeof(RtreeConstraint)*argc);
        memset(pCsr->anQueue, 0, sizeof(u32)*(pRtree->iDepth + 1));
        assert( (idxStr==0 && argc==0)
                || (idxStr && (int)strlen(idxStr)==argc*2) );
        for(ii=0; ii<argc; ii++){
          RtreeConstraint *p = &pCsr->aConstraint[ii];
          int eType = sqlite3_value_numeric_type(argv[ii]);
          p->op = idxStr[ii*2];
          p->iCoord = idxStr[ii*2+1]-'0';
          if( p->op>=RTREE_MATCH ){
            /* A MATCH operator. The right-hand-side must be a blob that
            ** can be cast into an RtreeMatchArg object. One created using
            ** an sqlite3_rtree_geometry_callback() SQL user function.
            */
            rc = deserializeGeometry(argv[ii], p);
            if( rc!=SQLITE_OK ){
              break;
            }
            p->pInfo->nCoord = pRtree->nDim2;
            p->pInfo->anQueue = pCsr->anQueue;
            p->pInfo->mxLevel = pRtree->iDepth + 1;
          }else if( eType==SQLITE_INTEGER ){
            sqlite3_int64 iVal = sqlite3_value_int64(argv[ii]);
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = iVal;
#else
            p->u.rValue = (double)iVal;
            if( iVal>=((sqlite3_int64)1)<<48
             || iVal<=-(((sqlite3_int64)1)<<48)
            ){
              if( p->op==RTREE_LT ) p->op = RTREE_LE;
              if( p->op==RTREE_GT ) p->op = RTREE_GE;
            }
#endif
          }else if( eType==SQLITE_FLOAT ){
#ifdef SQLITE_RTREE_INT_ONLY
            p->u.rValue = sqlite3_value_int64(argv[ii]);
#else
            p->u.rValue = sqlite3_value_double(argv[ii]);
#endif
          }else{
            p->u.rValue = RTREE_ZERO;
            if( eType==SQLITE_NULL ){
              p->op = RTREE_FALSE;
            }else if( p->op==RTREE_LT || p->op==RTREE_LE ){
              p->op = RTREE_TRUE;
            }else{
              p->op = RTREE_FALSE;
            }
          }
        }
      }
    }
    if( rc==SQLITE_OK ){
      RtreeSearchPoint *pNew;
      assert( pCsr->bPoint==0 );  /* Due to the resetCursor() call above */
      pNew = rtreeSearchPointNew(pCsr, RTREE_ZERO, (u8)(pRtree->iDepth+1));
      if( NEVER(pNew==0) ){       /* Because pCsr->bPoint was FALSE */
        return SQLITE_NOMEM;
      }
      pNew->id = 1;
      pNew->iCell = 0;
      pNew->eWithin = PARTLY_WITHIN;
      assert( pCsr->bPoint==1 );
      pCsr->aNode[0] = pRoot;
      pRoot = 0;
      RTREE_QUEUE_TRACE(pCsr, "PUSH-Fm:");
      rc = rtreeStepToLeaf(pCsr);
    }
  }

  nodeRelease(pRtree, pRoot);
  rtreeRelease(pRtree);
  return rc;
}